

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

void proto2_unittest::TestHugeFieldNumbersLite::SharedDtor(MessageLite *self)

{
  ForeignMessageLite *this;
  TestHugeFieldNumbersLite_OptionalGroup *this_00;
  ulong uVar1;
  LogMessageFatal local_20;
  
  google::protobuf::internal::InternalMetadata::Delete<std::__cxx11::string>
            (&self->_internal_metadata_);
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    google::protobuf::internal::ArenaStringPtr::Destroy
              ((ArenaStringPtr *)&self[7]._internal_metadata_);
    google::protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 8));
    this = (ForeignMessageLite *)self[8]._internal_metadata_.ptr_;
    if (this != (ForeignMessageLite *)0x0) {
      ForeignMessageLite::~ForeignMessageLite(this);
    }
    operator_delete(this,0x20);
    this_00 = (TestHugeFieldNumbersLite_OptionalGroup *)self[9]._vptr_MessageLite;
    if (this_00 != (TestHugeFieldNumbersLite_OptionalGroup *)0x0) {
      TestHugeFieldNumbersLite_OptionalGroup::~TestHugeFieldNumbersLite_OptionalGroup(this_00);
    }
    operator_delete(this_00,0x20);
    if (*(int *)&self[0xb]._vptr_MessageLite != 0) {
      clear_oneof_field((TestHugeFieldNumbersLite *)self);
    }
    Impl_::~Impl_((Impl_ *)(self + 1));
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_lite.pb.cc"
             ,0x2917,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

inline void TestHugeFieldNumbersLite::SharedDtor(MessageLite& self) {
  TestHugeFieldNumbersLite& this_ = static_cast<TestHugeFieldNumbersLite&>(self);
  this_._internal_metadata_.Delete<std::string>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.optional_string_.Destroy();
  this_._impl_.optional_bytes_.Destroy();
  delete this_._impl_.optional_message_;
  delete this_._impl_.optionalgroup_;
  if (this_.has_oneof_field()) {
    this_.clear_oneof_field();
  }
  this_._impl_.~Impl_();
}